

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O2

int sigfiddle_setnpoints(t_sigfiddle *x,t_floatarg fnpoints)

{
  int iVar1;
  t_float *ptVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint n;
  long lVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  
  n = (uint)fnpoints;
  sigfiddle_freebird(x);
  if (n - 0x2001 < 0xffffe07f) {
    n = 0x400;
    pd_error((void *)0x0,"fiddle~: npoints out of range; using %d",0x400);
  }
  iVar1 = sigfiddle_ilog2(n);
  uVar7 = 1 << ((byte)iVar1 & 0x1f);
  if (n != uVar7) {
    pd_error((void *)0x0,"fiddle~: npoints not a power of 2; using %d",(ulong)uVar7);
    n = uVar7;
  }
  x->x_hop = (int)n >> 1;
  ptVar2 = (t_float *)getbytes((long)((int)n >> 1) << 2);
  x->x_inbuf = ptVar2;
  if (ptVar2 != (t_float *)0x0) {
    ptVar2 = (t_float *)getbytes((long)x->x_hop * 8 + 0x50);
    x->x_lastanalysis = ptVar2;
    if (ptVar2 != (t_float *)0x0) {
      ptVar2 = (t_float *)getbytes((long)x->x_hop << 3);
      x->x_spiral = ptVar2;
      if (ptVar2 != (t_float *)0x0) {
        uVar7 = x->x_hop;
        uVar4 = 0;
        uVar5 = 0;
        if (0 < (int)uVar7) {
          uVar5 = (ulong)uVar7;
        }
        for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
          x->x_inbuf[uVar4] = 0.0;
        }
        uVar3 = 0xffffffec;
        if (-0x14 < (int)n) {
          uVar3 = n;
        }
        for (uVar4 = 0; uVar3 + 0x14 != uVar4; uVar4 = uVar4 + 1) {
          x->x_lastanalysis[uVar4] = 0.0;
        }
        for (lVar6 = 0; lVar6 < (int)uVar7; lVar6 = lVar6 + 1) {
          dVar8 = ((double)(int)lVar6 * 3.14159) / (double)(int)n;
          dVar9 = cos(dVar8);
          x->x_spiral[lVar6 * 2] = (float)dVar9;
          dVar8 = sin(dVar8);
          x->x_spiral[lVar6 * 2 + 1] = -(float)dVar8;
          uVar7 = x->x_hop;
        }
        x->x_phase = 0;
        return 1;
      }
    }
  }
  sigfiddle_freebird(x);
  return 0;
}

Assistant:

int sigfiddle_setnpoints(t_sigfiddle *x, t_floatarg fnpoints)
{
    int i, npoints = fnpoints;
    sigfiddle_freebird(x);
    if (npoints < MINPOINTS || npoints > MAXPOINTS)
    {
        pd_error(0, "fiddle~: npoints out of range; using %d",
            npoints = DEFAULTPOINTS);
    }
    if (npoints != (1 << sigfiddle_ilog2(npoints)))
    {
        pd_error(0, "fiddle~: npoints not a power of 2; using %d",
            npoints = (1 << sigfiddle_ilog2(npoints)));
    }
    x->x_hop = npoints >> 1;
    if (!(x->x_inbuf = (t_float *)getbytes(sizeof(t_float) * x->x_hop)))
        goto fail;
    if (!(x->x_lastanalysis = (t_float *)getbytes(
        sizeof(t_float) * (2 * x->x_hop + 4 * FILTSIZE))))
            goto fail;
    if (!(x->x_spiral = (t_float *)getbytes(sizeof(t_float) * 2 * x->x_hop)))
        goto fail;
    for (i = 0; i < x->x_hop; i++)
        x->x_inbuf[i] = 0;
    for (i = 0; i < npoints + 4 * FILTSIZE; i++)
        x->x_lastanalysis[i] = 0;
    for (i = 0; i < x->x_hop; i++)
        x->x_spiral[2*i] =    cos((3.14159*i)/(npoints)),
        x->x_spiral[2*i+1] = -sin((3.14159*i)/(npoints));
    x->x_phase = 0;
    return (1);
fail:
    sigfiddle_freebird(x);
    return (0);
}